

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_create_irreg_config
                  (Integer type,Integer ndim,Integer *dims,char *array_name,Integer *map,
                  Integer *nblock,Integer p_handle,Integer *g_a)

{
  logical lVar1;
  long in_RSI;
  Integer *in_stack_00000010;
  logical status;
  Integer width [7];
  Integer d;
  char *in_stack_ffffffffffffff80;
  Integer *in_stack_ffffffffffffff88;
  Integer *in_stack_ffffffffffffff90;
  Integer in_stack_ffffffffffffff98;
  Integer in_stack_ffffffffffffffa0;
  Integer *in_stack_ffffffffffffffb0;
  Integer in_stack_ffffffffffffffb8;
  Integer *in_stack_ffffffffffffffc0;
  long local_38;
  
  for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
    *(undefined8 *)(&stack0xffffffffffffff88 + local_38 * 8) = 0;
  }
  lVar1 = pnga_create_ghosts_irreg_config
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_00000010,
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  return lVar1;
}

Assistant:

logical pnga_create_irreg_config(
        Integer type,     /* MA type */ 
        Integer ndim,     /* number of dimensions */
        Integer dims[],   /* array of dimensions */
        char *array_name, /* array name */
        Integer map[],    /* decomposition map array */ 
        Integer nblock[], /* number of blocks for each dimension in map */
        Integer p_handle, /* processor list hande */
        Integer *g_a)     /* array handle (output) */
{
Integer  d,width[MAXDIM];
logical status;

      for (d=0; d<ndim; d++) width[d] = 0;
      status = pnga_create_ghosts_irreg_config(type, ndim, dims, width,
          array_name, map, nblock, p_handle, g_a);

      return status;
}